

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DrawIndexedIndirect
          (VulkanCommandBuffer *this,VkBuffer Buffer,VkDeviceSize Offset,uint32_t DrawCount,
          uint32_t Stride)

{
  bool bVar1;
  Char *pCVar2;
  undefined4 in_register_0000000c;
  undefined1 local_b8 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  uint32_t Stride_local;
  uint32_t DrawCount_local;
  VkDeviceSize Offset_local;
  VkBuffer Buffer_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_4_ = Stride;
  msg.field_2._12_4_ = DrawCount;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,DrawCount));
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawIndexedIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x95);
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = IsInRenderScope(this);
  if (!bVar1) {
    Diligent::FormatString<char[170]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [170])
               "vkCmdDrawIndexedIndirect() must be called inside render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDrawIndexedIndirect-renderpass)"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawIndexedIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x98);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((this->m_State).GraphicsPipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[27]>
              ((string *)((long)&msg_3.field_2 + 8),(char (*) [27])"No graphics pipeline bound");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawIndexedIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x99);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  if ((this->m_State).IndexBuffer == (VkBuffer)0x0) {
    Diligent::FormatString<char[22]>((string *)local_b8,(char (*) [22])"No index buffer bound");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawIndexedIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x9a);
    std::__cxx11::string::~string((string *)local_b8);
  }
  (*vkCmdDrawIndexedIndirect)
            (this->m_VkCmdBuffer,Buffer,Offset,msg.field_2._12_4_,msg.field_2._8_4_);
  return;
}

Assistant:

__forceinline void DrawIndexedIndirect(VkBuffer Buffer, VkDeviceSize Offset, uint32_t DrawCount, uint32_t Stride)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(IsInRenderScope(),
               "vkCmdDrawIndexedIndirect() must be called inside render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDrawIndexedIndirect-renderpass)");
        VERIFY(m_State.GraphicsPipeline != VK_NULL_HANDLE, "No graphics pipeline bound");
        VERIFY(m_State.IndexBuffer != VK_NULL_HANDLE, "No index buffer bound");

        vkCmdDrawIndexedIndirect(m_VkCmdBuffer, Buffer, Offset, DrawCount, Stride);
    }